

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O3

void __thiscall
adios2::format::BP5Serializer::OnetimeMarshalAttribute
          (BP5Serializer *this,char *Name,DataType Type,size_t ElemCount,void *Data)

{
  size_t sVar1;
  BP5AttrStruct *pBVar2;
  PrimitiveTypeAttr *pPVar3;
  StringArrayAttr *pSVar4;
  size_t sVar5;
  char *pcVar6;
  char **ppcVar7;
  char cVar8;
  DataType type;
  string *Str;
  size_t sVar9;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pBVar2 = this->PendingAttrs;
  if (pBVar2 == (BP5AttrStruct *)0x0) {
    pBVar2 = (BP5AttrStruct *)operator_new(0x20);
    pBVar2->PrimAttrCount = 0;
    pPVar3 = (PrimitiveTypeAttr *)malloc(1);
    pBVar2->PrimAttrs = pPVar3;
    pBVar2->StrAttrCount = 0;
    pSVar4 = (StringArrayAttr *)malloc(1);
    pBVar2->StrAttrs = pSVar4;
    this->PendingAttrs = pBVar2;
  }
  sVar5 = strlen(Name);
  pcVar6 = (char *)malloc(sVar5 + 2);
  cVar8 = 'B';
  if (ElemCount == 0xffffffffffffffff) {
    cVar8 = '0';
  }
  *pcVar6 = cVar8 + (char)Type;
  strcpy(pcVar6 + 1,Name);
  if (Type == String) {
    sVar1 = pBVar2->StrAttrCount;
    pBVar2->StrAttrCount = sVar1 + 1;
    pSVar4 = (StringArrayAttr *)realloc(pBVar2->StrAttrs,(sVar1 * 8 + 8) * 3);
    pBVar2 = this->PendingAttrs;
    pBVar2->StrAttrs = pSVar4;
    sVar1 = pBVar2->StrAttrCount;
    pSVar4[sVar1 - 1].ElementCount = 0;
    pSVar4[sVar1 - 1].Values = (char **)0x0;
    pSVar4[sVar1 - 1].Name = pcVar6;
    if (ElemCount == 0xffffffffffffffff) {
      pSVar4[sVar1 - 1].ElementCount = 1;
      ppcVar7 = (char **)malloc(8);
      pSVar4[sVar1 - 1].Values = ppcVar7;
      pcVar6 = strdup(*Data);
      *ppcVar7 = pcVar6;
    }
    else {
      pSVar4[sVar1 - 1].ElementCount = ElemCount;
      ppcVar7 = (char **)malloc(ElemCount * 8);
      pSVar4[sVar1 - 1].Values = ppcVar7;
      if (ElemCount != 0) {
        sVar9 = 0;
        do {
          pcVar6 = strdup(*Data);
          pSVar4[sVar1 - 1].Values[sVar9] = pcVar6;
          sVar9 = sVar9 + 1;
          Data = (void *)((long)Data + 0x20);
        } while (ElemCount != sVar9);
      }
    }
  }
  else {
    if ((Type & ~Struct) == None) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Toolkit","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"format::BP5Serializer","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"doesn\'t support this type of Attribute","");
      ToString_abi_cxx11_(&local_50,(adios2 *)(ulong)Type,type);
      helper::Throw<std::logic_error>(&local_70,&local_90,&local_b0,&local_50,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      pBVar2 = this->PendingAttrs;
    }
    sVar1 = pBVar2->PrimAttrCount;
    pBVar2->PrimAttrCount = sVar1 + 1;
    pPVar3 = (PrimitiveTypeAttr *)realloc(pBVar2->PrimAttrs,(sVar1 * 8 + 8) * 3);
    pBVar2 = this->PendingAttrs;
    pBVar2->PrimAttrs = pPVar3;
    sVar1 = pBVar2->PrimAttrCount;
    sVar9 = 1;
    if (ElemCount != 0xffffffffffffffff) {
      sVar9 = ElemCount;
    }
    pPVar3[sVar1 - 1].TotalElementSize = 0;
    (&pPVar3[sVar1 - 1].TotalElementSize)[1] = 0;
    pPVar3[sVar1 - 1].Name = pcVar6;
    sVar5 = sVar9 * *(long *)((long)&this->_vptr_BP5Serializer +
                             (long)(this->_vptr_BP5Serializer[-3] + (long)(int)Type * 8));
    pPVar3[sVar1 - 1].TotalElementSize = sVar5;
    pcVar6 = (char *)malloc(sVar5);
    pPVar3[sVar1 - 1].Values = pcVar6;
    memcpy(pcVar6,Data,sVar5);
  }
  return;
}

Assistant:

void BP5Serializer::OnetimeMarshalAttribute(const char *Name, const DataType Type, size_t ElemCount,
                                            const void *Data)
{
    if (!PendingAttrs)
        PendingAttrs = new (BP5AttrStruct);
    char *TmpName = (char *)malloc(strlen(Name) + 2);
    TmpName[0] = '0' + (int)Type;
    if (ElemCount != (size_t)-1)
        TmpName[0] += 18; // indicates an array
    strcpy(&TmpName[1], Name);
    if (Type == DataType::String)
    {
        PendingAttrs->StrAttrCount++;
        PendingAttrs->StrAttrs = (struct StringArrayAttr *)realloc(
            PendingAttrs->StrAttrs, sizeof(StringArrayAttr) * PendingAttrs->StrAttrCount);
        StringArrayAttr *ThisAttr = &PendingAttrs->StrAttrs[PendingAttrs->StrAttrCount - 1];
        memset((void *)ThisAttr, 0, sizeof(*ThisAttr));
        ThisAttr->Name = TmpName;
        if (ElemCount == (size_t)-1)
        {
            std::string *Str = (std::string *)Data;
            ThisAttr->ElementCount = 1;
            ThisAttr->Values = (const char **)malloc(sizeof(char *));
            ThisAttr->Values[0] = strdup(Str->c_str());
        }
        else
        {
            std::string *StrArray = (std::string *)Data;
            ThisAttr->ElementCount = ElemCount;
            ThisAttr->Values = (const char **)malloc(sizeof(char *) * ElemCount);
            for (size_t i = 0; i < ElemCount; i++)
            {
                ThisAttr->Values[i] = strdup(StrArray[i].c_str());
            }
        }
    }
    else
    {
        if ((Type == DataType::None) || (Type == DataType::Struct))
        {
            helper::Throw<std::logic_error>("Toolkit", "format::BP5Serializer",
                                            "doesn't support this type of Attribute",
                                            ToString(Type));
        }
        char *Array = (char *)Data;
        PendingAttrs->PrimAttrCount++;
        PendingAttrs->PrimAttrs = (struct PrimitiveTypeAttr *)realloc(
            PendingAttrs->PrimAttrs, sizeof(PrimitiveTypeAttr) * PendingAttrs->PrimAttrCount);
        PrimitiveTypeAttr *ThisAttr = &PendingAttrs->PrimAttrs[PendingAttrs->PrimAttrCount - 1];
        if (ElemCount == (size_t)-1)
        {
            ElemCount = 1;
        }
        memset((void *)ThisAttr, 0, sizeof(*ThisAttr));
        ThisAttr->Name = TmpName;
        ThisAttr->TotalElementSize = ElemCount * DataTypeSize[(int)Type];
        ThisAttr->Values = (char *)malloc(ThisAttr->TotalElementSize);
        std::memcpy((void *)ThisAttr->Values, (void *)Array, ThisAttr->TotalElementSize);
    }
}